

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_star_expression.cpp
# Opt level: O2

optional_ptr<duckdb::ParsedExpression,_true>
duckdb::Binder::GetResolvedColumnExpression(ParsedExpression *root_expr)

{
  ParsedExpression *pPVar1;
  BaseExpression *this;
  OperatorExpression *pOVar2;
  reference pvVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_18;
  
  while (((_Var4._M_head_impl = (ParsedExpression *)0x0, root_expr != (ParsedExpression *)0x0 &&
          (local_18._M_head_impl = root_expr,
          pPVar1 = optional_ptr<duckdb::ParsedExpression,_true>::operator->
                             ((optional_ptr<duckdb::ParsedExpression,_true> *)&local_18),
          _Var4._M_head_impl = local_18._M_head_impl,
          (pPVar1->super_BaseExpression).type != COLUMN_REF)) &&
         (pPVar1 = optional_ptr<duckdb::ParsedExpression,_true>::operator->
                             ((optional_ptr<duckdb::ParsedExpression,_true> *)&local_18),
         _Var4._M_head_impl = (ParsedExpression *)0x0,
         (pPVar1->super_BaseExpression).type == OPERATOR_COALESCE))) {
    this = &optional_ptr<duckdb::ParsedExpression,_true>::operator->
                      ((optional_ptr<duckdb::ParsedExpression,_true> *)&local_18)->
            super_BaseExpression;
    pOVar2 = BaseExpression::Cast<duckdb::OperatorExpression>(this);
    pvVar3 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
             ::get<true>(&pOVar2->children,0);
    root_expr = (pvVar3->
                super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                )._M_t.
                super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  }
  return (optional_ptr<duckdb::ParsedExpression,_true>)_Var4._M_head_impl;
}

Assistant:

optional_ptr<ParsedExpression> Binder::GetResolvedColumnExpression(ParsedExpression &root_expr) {
	optional_ptr<ParsedExpression> expr = &root_expr;
	while (expr) {
		if (expr->GetExpressionType() == ExpressionType::COLUMN_REF) {
			break;
		}
		if (expr->GetExpressionType() == ExpressionType::OPERATOR_COALESCE) {
			expr = expr->Cast<OperatorExpression>().children[0].get();
		} else {
			// unknown expression
			return nullptr;
		}
	}
	return expr;
}